

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

void __thiscall amrex::ForkJoin::copy_data_to_tasks(ForkJoin *this)

{
  FabArrayBase *this_00;
  bool bVar1;
  int iVar2;
  Long LVar3;
  MFFork *pMVar4;
  byte *in_RDI;
  DistributionMapping *dm;
  int task_comp_n;
  int i;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *forked;
  Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_> *comp_split;
  BoxArray *ba;
  MultiFab *orig;
  MFFork *mff;
  int idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mf_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>
  *p;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a8;
  Print *in_stack_fffffffffffff6b0;
  MultiFab *in_stack_fffffffffffff6b8;
  FabArrayBase *in_stack_fffffffffffff6c0;
  Print *in_stack_fffffffffffff6c8;
  Print *in_stack_fffffffffffff6d0;
  Print *in_stack_fffffffffffff6d8;
  Print *in_stack_fffffffffffff6e0;
  Print *in_stack_fffffffffffff720;
  Print local_820;
  DistributionMapping *in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffab4;
  BoxArray *in_stack_fffffffffffffab8;
  ForkJoin *in_stack_fffffffffffffac0;
  int local_1fc;
  int local_1cc;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
  local_1b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
  local_1b0;
  byte *local_1a8;
  
  if ((*in_RDI & 1) != 0) {
    OutStream();
    Print::Print(in_stack_fffffffffffff6e0,(ostream *)in_stack_fffffffffffff6d8);
    Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [39])in_stack_fffffffffffff6a8);
    Print::~Print(in_stack_fffffffffffff720);
  }
  local_1a8 = in_RDI + 0x58;
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
                *)in_stack_fffffffffffff6a8);
  local_1b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
              *)in_stack_fffffffffffff6a8);
  while (bVar1 = std::__detail::operator!=(&local_1b0,&local_1b8), bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
                 *)0x12120e5);
    for (local_1cc = 0;
        LVar3 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::size
                          ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                            *)0x1212129), local_1cc < LVar3; local_1cc = local_1cc + 1) {
      pMVar4 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::operator[]
                         ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                           *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      this_00 = (FabArrayBase *)pMVar4->orig;
      FabArrayBase::boxArray(this_00);
      NTasks((ForkJoin *)0x12121cb);
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::reserve
                ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff6e0,(size_type)in_stack_fffffffffffff6d8);
      for (local_1fc = 0; iVar2 = NTasks((ForkJoin *)0x1212201), local_1fc < iVar2;
          local_1fc = local_1fc + 1) {
        if ((pMVar4->strategy == single) && (local_1fc != pMVar4->owner_task)) {
          LVar3 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x121280c)
          ;
          if (LVar3 <= local_1fc) {
            in_stack_fffffffffffff6b0 = &local_820;
            in_stack_fffffffffffff6a8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pMVar4->forked;
            MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff6b0);
            std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::push_back
                      ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                       in_stack_fffffffffffff6b0,(value_type *)in_stack_fffffffffffff6a8);
            MultiFab::~MultiFab((MultiFab *)0x1212854);
          }
        }
        else {
          Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
          operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                      *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
          Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
          operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                      *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
          LVar3 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x121228c)
          ;
          if (local_1fc < LVar3) {
            if ((*in_RDI & 1) != 0) {
              OutStream();
              Print::Print(in_stack_fffffffffffff6e0,(ostream *)in_stack_fffffffffffff6d8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [10])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [2])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [12])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              in_stack_fffffffffffff720 =
                   Print::operator<<(in_stack_fffffffffffff6b0,
                                     (char (*) [17])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,
                                (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                                 *)in_stack_fffffffffffff6a8);
              Print::~Print(in_stack_fffffffffffff720);
            }
          }
          else {
            if ((*in_RDI & 1) != 0) {
              OutStream();
              Print::Print(in_stack_fffffffffffff6e0,(ostream *)in_stack_fffffffffffff6d8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [19])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [2])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [12])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [9])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,
                                (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                                 *)in_stack_fffffffffffff6a8);
              Print::~Print(in_stack_fffffffffffff720);
            }
            FabArrayBase::DistributionMap(this_00);
            get_dm(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
                   in_stack_fffffffffffffaa8);
            std::vector<amrex::MultiFab,std::allocator<amrex::MultiFab>>::
            emplace_back<amrex::BoxArray_const&,amrex::DistributionMapping_const&,int&,amrex::IntVect&>
                      ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                       in_stack_fffffffffffff6d0,(BoxArray *)in_stack_fffffffffffff6c8,
                       (DistributionMapping *)in_stack_fffffffffffff6c0,
                       (int *)in_stack_fffffffffffff6b8,(IntVect *)in_stack_fffffffffffff6b0);
          }
          if ((pMVar4->intent == in) || (pMVar4->intent == inout)) {
            if ((*in_RDI & 1) != 0) {
              OutStream();
              Print::Print(in_stack_fffffffffffff6e0,(ostream *)in_stack_fffffffffffff6d8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [13])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [2])in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(char (*) [15])in_stack_fffffffffffff6a8);
              Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
              ::operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                            *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              in_stack_fffffffffffff6e0 =
                   Print::operator<<(in_stack_fffffffffffff6b0,
                                     (char (*) [3])in_stack_fffffffffffff6a8);
              Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
              ::operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                            *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
              in_stack_fffffffffffff6d8 =
                   Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              in_stack_fffffffffffff6d0 =
                   Print::operator<<(in_stack_fffffffffffff6b0,
                                     (char (*) [16])in_stack_fffffffffffff6a8);
              in_stack_fffffffffffff6c8 =
                   Print::operator<<(in_stack_fffffffffffff6b0,(int *)in_stack_fffffffffffff6a8);
              Print::operator<<(in_stack_fffffffffffff6b0,
                                (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                                 *)in_stack_fffffffffffff6a8);
              Print::~Print(in_stack_fffffffffffff720);
            }
            in_stack_fffffffffffff6b8 =
                 Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                           ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                            in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
            in_stack_fffffffffffff6c0 = this_00;
            Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
            operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                        *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
            FabArray<amrex::FArrayBox>::Redistribute
                      ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff6d0,
                       (FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff6c8,
                       (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20),
                       (int)in_stack_fffffffffffff6c0,
                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                       (IntVect *)in_stack_fffffffffffff6b0);
          }
        }
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
                  *)in_stack_fffffffffffff6b0);
  }
  return;
}

Assistant:

void
ForkJoin::copy_data_to_tasks ()
{
    BL_PROFILE("ForkJoin::copy_data_to_tasks()");
    if (flag_verbose) {
        amrex::Print() << "Copying data into fork-join tasks ...\n";
    }
    for (auto &p : data) { // for each name
        const auto &mf_name = p.first;
        for (int idx = 0; idx < p.second.size(); ++idx) { // for each index
            auto &mff = p.second[idx];
            const auto &orig = *mff.orig;
            const auto &ba = orig.boxArray();
            const auto &comp_split = mff.comp_split;
            auto &forked = mff.forked;

            forked.reserve(NTasks()); // does nothing if forked MFs already created
            for (int i = 0; i < NTasks(); ++i) {
                // check if this task needs this MF
                if (mff.strategy != Strategy::single || i == mff.owner_task) {
                    int task_comp_n = comp_split[i].hi - comp_split[i].lo;

                    // create task's MF if first time through
                    if (forked.size() <= i) {
                        if (flag_verbose) {
                            amrex::Print() << "  Creating forked " << mf_name << "[" << idx << "] for task " << i
                                           << (mff.strategy == Strategy::split ? " (split)" : " (whole)") << std::endl;
                        }
                        // look up the distribution mapping for this (box array, task) pair
                        const DistributionMapping &dm = get_dm(ba, i, orig.DistributionMap());
                        forked.emplace_back(ba, dm, task_comp_n, mff.ngrow);
                    } else if (flag_verbose) {
                        amrex::Print() << "  Forked " << mf_name << "[" << idx << "] for task " << i
                                       << " already created" << std::endl;
                    }
                    AMREX_ASSERT(i < forked.size());

                    // copy data if needed
                    if (mff.intent == Intent::in || mff.intent == Intent::inout) {
                        if (flag_verbose) {
                            amrex::Print() << "    Copying " << mf_name << "[" << idx << "] components ["
                                           << comp_split[i].lo << ", " << comp_split[i].hi << ") into to task " << i << std::endl;
                        }
                        // parallel copy data into forked MF
                        forked[i].Redistribute(orig, comp_split[i].lo, 0, task_comp_n, mff.ngrow);
                    }

                } else {
                    // this task doesn't use the MultiFab
                    if (forked.size() <= i) {
                        // first time through, push empty placeholder (not used)
                        forked.push_back(MultiFab());
                    }
                }
            }
            AMREX_ASSERT(forked.size() == NTasks());
        }
    }
}